

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0513(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  _Alloc_hider _Var2;
  size_type in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffe40;
  long in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe60;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe78 [64];
  _Alloc_hider in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffed0 [16];
  pointer in_stack_fffffffffffffee0;
  pointer in_stack_fffffffffffffee8;
  pointer local_110;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_108;
  pointer local_e8;
  pointer local_d8;
  Expectation local_d0;
  
  puVar3 = &stack0xfffffffffffffe48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe38,"enum x { (","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe78);
  _Var2._M_p = &stack0xfffffffffffffe28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe18,
             Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofEnumerationConstant_abi_cxx11_.
             _M_dataplus._M_p,
             Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofEnumerationConstant_abi_cxx11_.
             _M_dataplus._M_p +
             Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofEnumerationConstant_abi_cxx11_.
             _M_string_length);
  pEVar1 = Expectation::diagnostic
                     ((Expectation *)&stack0xfffffffffffffe78,Error,
                      (string *)&stack0xfffffffffffffe18);
  Expectation::Expectation(&local_d0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe58);
  text._M_string_length = in_stack_fffffffffffffe60.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe68.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe70;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe20;
  X._0_8_ = _Var2._M_p;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe28;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe30;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar3;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe40;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe48;
  X.continueTestDespiteOfErrors_ = (bool)(char)in_stack_fffffffffffffe50;
  X.containsAmbiguity_ = (bool)(char)((ulong)in_stack_fffffffffffffe50 >> 8);
  X._58_6_ = (int6)((ulong)in_stack_fffffffffffffe50 >> 0x10);
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe60.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe68.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe70;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe78[0];
  X._97_7_ = in_stack_fffffffffffffe78._1_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe78._8_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe78._32_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe78[0x38];
  X._153_7_ = in_stack_fffffffffffffe78._57_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffeb8._M_p;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffec0;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffec8;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffee0;
  parseOpts.langDialect_.std_ = in_stack_fffffffffffffed0[0];
  parseOpts._1_7_ = in_stack_fffffffffffffed0._1_7_;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffed0._8_8_;
  parseOpts._24_8_ = in_stack_fffffffffffffee8;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe38,parseOpts);
  if (local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_d0.declarations_);
  if (local_d0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.ambiguityText_._M_dataplus._M_p != &local_d0.ambiguityText_.field_2) {
    operator_delete(local_d0.ambiguityText_._M_dataplus._M_p,
                    local_d0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.descriptorsE_);
  if (_Var2._M_p != &stack0xfffffffffffffe28) {
    operator_delete(_Var2._M_p,in_stack_fffffffffffffe28 + 1);
  }
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_108);
  if (in_stack_fffffffffffffee0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffee0,(long)local_110 - (long)in_stack_fffffffffffffee0);
  }
  if (in_stack_fffffffffffffeb8._M_p != &stack0xfffffffffffffec8) {
    operator_delete(in_stack_fffffffffffffeb8._M_p,in_stack_fffffffffffffec8 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe80);
  if (puVar3 != &stack0xfffffffffffffe48) {
    operator_delete(puVar3,in_stack_fffffffffffffe48 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0513()
{
    parse("enum x { (",
          Expectation().diagnostic(Expectation::ErrorOrWarn::Error,
                                      Parser::DiagnosticsReporter::ID_of_ExpectedFIRSTofEnumerationConstant));
}